

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.cpp
# Opt level: O0

unsigned_long_long duckdb_zstd::XXH64(void *input,size_t len,unsigned_long_long seed)

{
  U32 UVar1;
  byte *pbVar2;
  U64 UVar3;
  ulong uVar4;
  U64 in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  XXH_endianess endian_detected;
  U64 k1_1;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  BYTE *limit_1;
  U64 h64_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  U64 k1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  BYTE *limit;
  U64 h64;
  BYTE *bEnd;
  BYTE *p;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  U64 in_stack_fffffffffffffd00;
  U64 local_180;
  U64 local_178;
  U64 local_170;
  U64 local_168;
  U64 local_158;
  byte *local_148;
  
  pbVar2 = in_RDI + in_RSI;
  local_148 = in_RDI;
  if (in_RSI < 0x20) {
    local_158 = in_RDX + 0x27d4eb2f165667c5;
  }
  else {
    local_168 = in_RDX + 0x60ea27eeadc0b5d6;
    local_170 = in_RDX + 0xc2b2ae3d27d4eb4f;
    local_180 = in_RDX + 0x61c8864e7a143579;
    local_178 = in_RDX;
    do {
      UVar3 = XXH_read64(local_148);
      local_168 = XXH64_round(local_168,UVar3);
      UVar3 = XXH_read64(local_148 + 8);
      local_170 = XXH64_round(local_170,UVar3);
      UVar3 = XXH_read64(local_148 + 0x10);
      local_178 = XXH64_round(local_178,UVar3);
      UVar3 = XXH_read64(local_148 + 0x18);
      local_180 = XXH64_round(local_180,UVar3);
      local_148 = local_148 + 0x20;
    } while (local_148 <= pbVar2 + -0x20);
    XXH64_mergeRound(in_stack_fffffffffffffd00,
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    XXH64_mergeRound(in_stack_fffffffffffffd00,
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    XXH64_mergeRound(in_stack_fffffffffffffd00,
                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_158 = XXH64_mergeRound(in_stack_fffffffffffffd00,
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  }
  local_158 = in_RSI + local_158;
  for (; local_148 + 8 <= pbVar2; local_148 = local_148 + 8) {
    UVar3 = XXH_read64(local_148);
    UVar3 = XXH64_round(0,UVar3);
    local_158 = ((UVar3 ^ local_158) << 0x1b | (UVar3 ^ local_158) >> 0x25) * -0x61c8864e7a143579 +
                0x85ebca77c2b2ae63;
  }
  if (local_148 + 4 <= pbVar2) {
    UVar1 = XXH_read32(local_148);
    uVar4 = (ulong)UVar1 * -0x61c8864e7a143579 ^ local_158;
    local_158 = (uVar4 << 0x17 | uVar4 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    local_148 = local_148 + 4;
  }
  for (; local_148 < pbVar2; local_148 = local_148 + 1) {
    uVar4 = (ulong)*local_148 * 0x27d4eb2f165667c5 ^ local_158;
    local_158 = (uVar4 << 0xb | uVar4 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar4 = (local_158 >> 0x21 ^ local_158) * -0x3d4d51c2d82b14b1;
  uVar4 = (uVar4 >> 0x1d ^ uVar4) * 0x165667b19e3779f9;
  return uVar4 >> 0x20 ^ uVar4;
}

Assistant:

XXH_PUBLIC_API unsigned long long XXH64 (const void* input, size_t len, unsigned long long seed)
{
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH64_CREATESTATE_STATIC(state);
    XXH64_reset(state, seed);
    XXH64_update(state, input, len);
    return XXH64_digest(state);
#else
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if (XXH_FORCE_ALIGN_CHECK) {
        if ((((size_t)input) & 7)==0) {  /* Input is aligned, let's leverage the speed advantage */
            if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
                return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned);
            else
                return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned);
    }   }

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned);
    else
        return XXH64_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned);
#endif
}